

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_try_cleanup(ssh_sharing_connstate *cs)

{
  ssh_sharing_state *psVar1;
  int iVar2;
  share_halfchannel *hc_00;
  strbuf *psVar3;
  share_channel *chan_00;
  share_forwarding *fwd_00;
  ssh_sharing_state *sharestate;
  strbuf *packet_2;
  strbuf *packet_1;
  strbuf *packet;
  share_forwarding *fwd;
  share_channel *chan;
  share_halfchannel *hc;
  int i;
  ssh_sharing_connstate *cs_local;
  
  while (hc_00 = (share_halfchannel *)index234(cs->halfchannels,0),
        hc_00 != (share_halfchannel *)0x0) {
    psVar3 = strbuf_new();
    BinarySink_put_uint32(psVar3->binarysink_,(ulong)hc_00->server_id);
    BinarySink_put_uint32(psVar3->binarysink_,2);
    BinarySink_put_stringz(psVar3->binarysink_,"PuTTY downstream no longer available");
    BinarySink_put_stringz(psVar3->binarysink_,"en");
    ssh_send_packet_from_downstream
              (cs->parent->cl,cs->id,0x5c,psVar3->s,(int)psVar3->len,
               "cleanup after downstream went away");
    strbuf_free(psVar3);
    share_remove_halfchannel(cs,hc_00);
  }
  hc._4_4_ = 0;
  while (chan_00 = (share_channel *)index234(cs->channels_by_us,hc._4_4_),
        chan_00 != (share_channel *)0x0) {
    if ((chan_00->state != 1) && (chan_00->state != 3)) {
      psVar3 = strbuf_new();
      BinarySink_put_uint32(psVar3->binarysink_,(ulong)chan_00->server_id);
      ssh_send_packet_from_downstream
                (cs->parent->cl,cs->id,0x61,psVar3->s,(int)psVar3->len,
                 "cleanup after downstream went away");
      strbuf_free(psVar3);
      if (chan_00->state == 2) {
        ssh_delete_sharing_channel(cs->parent->cl,chan_00->upstream_id);
        share_remove_channel(cs,chan_00);
        hc._4_4_ = hc._4_4_ + -1;
      }
      else {
        chan_00->state = 1;
      }
    }
    hc._4_4_ = hc._4_4_ + 1;
  }
  hc._4_4_ = 0;
  while (fwd_00 = (share_forwarding *)index234(cs->forwardings,hc._4_4_),
        fwd_00 != (share_forwarding *)0x0) {
    if ((fwd_00->active & 1U) != 0) {
      psVar3 = strbuf_new();
      BinarySink_put_stringz(psVar3->binarysink_,"cancel-tcpip-forward");
      BinarySink_put_bool(psVar3->binarysink_,false);
      BinarySink_put_stringz(psVar3->binarysink_,fwd_00->host);
      BinarySink_put_uint32(psVar3->binarysink_,(long)fwd_00->port);
      ssh_send_packet_from_downstream
                (cs->parent->cl,cs->id,0x50,psVar3->s,(int)psVar3->len,
                 "cleanup after downstream went away");
      strbuf_free(psVar3);
      ssh_rportfwd_remove(cs->parent->cl,fwd_00->rpf);
      share_remove_forwarding(cs,fwd_00);
      hc._4_4_ = hc._4_4_ + -1;
    }
    hc._4_4_ = hc._4_4_ + 1;
  }
  iVar2 = count234(cs->halfchannels);
  if (((iVar2 == 0) && (iVar2 = count234(cs->channels_by_us), iVar2 == 0)) &&
     (iVar2 = count234(cs->forwardings), iVar2 == 0)) {
    psVar1 = cs->parent;
    del234(psVar1->connections,cs);
    log_downstream(cs,"disconnected");
    share_connstate_free(cs);
    iVar2 = count234(psVar1->connections);
    if ((iVar2 == 0) && (psVar1->cl != (ConnectionLayer *)0x0)) {
      ssh_sharing_no_more_downstreams(psVar1->cl);
    }
  }
  return;
}

Assistant:

static void share_try_cleanup(struct ssh_sharing_connstate *cs)
{
    int i;
    struct share_halfchannel *hc;
    struct share_channel *chan;
    struct share_forwarding *fwd;

    /*
     * Any half-open channels, i.e. those for which we'd received
     * CHANNEL_OPEN from the server but not passed back a response
     * from downstream, should be responded to with OPEN_FAILURE.
     */
    while ((hc = (struct share_halfchannel *)
            index234(cs->halfchannels, 0)) != NULL) {
        static const char reason[] = "PuTTY downstream no longer available";
        static const char lang[] = "en";
        strbuf *packet;

        packet = strbuf_new();
        put_uint32(packet, hc->server_id);
        put_uint32(packet, SSH2_OPEN_CONNECT_FAILED);
        put_stringz(packet, reason);
        put_stringz(packet, lang);
        ssh_send_packet_from_downstream(
            cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_OPEN_FAILURE,
            packet->s, packet->len,
            "cleanup after downstream went away");
        strbuf_free(packet);

        share_remove_halfchannel(cs, hc);
    }

    /*
     * Any actually open channels should have a CHANNEL_CLOSE sent for
     * them, unless we've already done so. We won't be able to
     * actually clean them up until CHANNEL_CLOSE comes back from the
     * server, though (unless the server happens to have sent a CLOSE
     * already).
     *
     * Another annoying exception is UNACKNOWLEDGED channels, i.e.
     * we've _sent_ a CHANNEL_OPEN to the server but not received an
     * OPEN_CONFIRMATION or OPEN_FAILURE. We must wait for a reply
     * before closing the channel, because until we see that reply we
     * won't have the server's channel id to put in the close message.
     */
    for (i = 0; (chan = (struct share_channel *)
                 index234(cs->channels_by_us, i)) != NULL; i++) {
        strbuf *packet;

        if (chan->state != SENT_CLOSE && chan->state != UNACKNOWLEDGED) {
            packet = strbuf_new();
            put_uint32(packet, chan->server_id);
            ssh_send_packet_from_downstream(
                cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_CLOSE,
                packet->s, packet->len,
                "cleanup after downstream went away");
            strbuf_free(packet);

            if (chan->state != RCVD_CLOSE) {
                chan->state = SENT_CLOSE;
            } else {
                /* In this case, we _can_ clear up the channel now. */
                ssh_delete_sharing_channel(cs->parent->cl, chan->upstream_id);
                share_remove_channel(cs, chan);
                i--;    /* don't accidentally skip one as a result */
            }
        }
    }

    /*
     * Any remote port forwardings we're managing on behalf of this
     * downstream should be cancelled. Again, we must defer those for
     * which we haven't yet seen REQUEST_SUCCESS/FAILURE.
     *
     * We take a fire-and-forget approach during cleanup, not
     * bothering to set want_reply.
     */
    for (i = 0; (fwd = (struct share_forwarding *)
                 index234(cs->forwardings, i)) != NULL; i++) {
        if (fwd->active) {
            strbuf *packet = strbuf_new();
            put_stringz(packet, "cancel-tcpip-forward");
            put_bool(packet, false);       /* !want_reply */
            put_stringz(packet, fwd->host);
            put_uint32(packet, fwd->port);
            ssh_send_packet_from_downstream(
                cs->parent->cl, cs->id, SSH2_MSG_GLOBAL_REQUEST,
                packet->s, packet->len,
                "cleanup after downstream went away");
            strbuf_free(packet);

            ssh_rportfwd_remove(cs->parent->cl, fwd->rpf);
            share_remove_forwarding(cs, fwd);
            i--;    /* don't accidentally skip one as a result */
        }
    }

    if (count234(cs->halfchannels) == 0 &&
        count234(cs->channels_by_us) == 0 &&
        count234(cs->forwardings) == 0) {
        struct ssh_sharing_state *sharestate = cs->parent;

        /*
         * Now we're _really_ done, so we can get rid of cs completely.
         */
        del234(sharestate->connections, cs);
        log_downstream(cs, "disconnected");
        share_connstate_free(cs);

        /*
         * And if this was the last downstream, notify the connection
         * layer, because it might now be time to wind up the whole
         * SSH connection.
         */
        if (count234(sharestate->connections) == 0 && sharestate->cl)
            ssh_sharing_no_more_downstreams(sharestate->cl);
    }
}